

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucmndata.cpp
# Opt level: O1

DataHeader *
pointerTOCLookupFn(UDataMemory *pData,char *name,int32_t *pLength,UErrorCode *pErrorCode)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  byte bVar5;
  int *piVar6;
  DataHeader *pDVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  int32_t pl_2;
  int iVar11;
  int iVar12;
  int32_t pl_1;
  int iVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  ulong in_R11;
  long *plVar17;
  
  piVar6 = (int *)pData->toc;
  if (piVar6 == (int *)0x0) {
    pDVar7 = pData->pHeader;
  }
  else {
    plVar17 = (long *)(piVar6 + 2);
    if ((long)*piVar6 == 0) {
LAB_002ea633:
      uVar14 = 0xffffffff;
    }
    else {
      lVar16 = 0;
      iVar12 = 0;
      do {
        cVar2 = name[lVar16];
        cVar3 = *(char *)(*plVar17 + lVar16);
        in_R11 = CONCAT71((int7)(in_R11 >> 8),cVar3);
        bVar10 = cVar2 != '\0' && cVar2 == cVar3;
        iVar12 = iVar12 + (uint)bVar10;
        lVar16 = lVar16 + 1;
      } while (bVar10);
      uVar14 = 0;
      if (cVar2 != cVar3) {
        uVar8 = (long)*piVar6 - 1;
        lVar16 = 0;
        iVar13 = 0;
        do {
          cVar2 = name[lVar16];
          in_R11 = CONCAT71((int7)(in_R11 >> 8),cVar2);
          pcVar1 = (char *)(plVar17[uVar8 * 2] + lVar16);
          bVar10 = cVar2 != '\0' && cVar2 == *pcVar1;
          iVar13 = iVar13 + (uint)bVar10;
          lVar16 = lVar16 + 1;
        } while (bVar10);
        if (cVar2 == *pcVar1) {
          uVar14 = (uint)uVar8;
        }
        else {
          iVar15 = 1;
          do {
            if ((int)uVar8 <= iVar15) goto LAB_002ea633;
            uVar14 = (uint)(iVar15 + (int)uVar8) >> 1;
            uVar9 = (ulong)uVar14;
            iVar11 = iVar13;
            if (iVar12 < iVar13) {
              iVar11 = iVar12;
            }
            lVar16 = (long)iVar11;
            do {
              bVar4 = name[lVar16];
              bVar5 = *(byte *)(plVar17[uVar9 * 2] + lVar16);
              bVar10 = bVar4 != 0 && bVar4 == bVar5;
              iVar11 = iVar11 + (uint)bVar10;
              lVar16 = lVar16 + 1;
            } while (bVar10);
            bVar10 = true;
            if (bVar4 < bVar5) {
LAB_002ea624:
              uVar8 = uVar9;
              uVar9 = in_R11 & 0xffffffff;
              iVar13 = iVar11;
            }
            else {
              if (bVar4 != bVar5) {
                iVar15 = uVar14 + 1;
                uVar9 = uVar8;
                iVar12 = iVar11;
                iVar11 = iVar13;
                goto LAB_002ea624;
              }
              bVar10 = false;
            }
            uVar14 = (uint)uVar9;
            in_R11 = uVar9;
          } while (bVar10);
        }
      }
    }
    if (-1 < (int)uVar14) {
      *pLength = -1;
      pDVar7 = UDataMemory_normalizeDataPointer_63(*(void **)(piVar6 + (ulong)uVar14 * 4 + 4));
      return pDVar7;
    }
    pDVar7 = (DataHeader *)0x0;
  }
  return pDVar7;
}

Assistant:

static const DataHeader * U_CALLCONV pointerTOCLookupFn(const UDataMemory *pData,
                   const char *name,
                   int32_t *pLength,
                   UErrorCode *pErrorCode) {
    (void)pErrorCode;
    if(pData->toc!=NULL) {
        const PointerTOC *toc = (PointerTOC *)pData->toc;
        int32_t number, count=(int32_t)toc->count;

#if defined (UDATA_DEBUG_DUMP)
        /* list the contents of the TOC each time .. not recommended */
        for(number=0; number<count; ++number) {
            fprintf(stderr, "\tx%d: %s\n", number, toc->entry[number].entryName);
        }
#endif
        number=pointerTOCPrefixBinarySearch(name, toc->entry, count);
        if(number>=0) {
            /* found it */
#ifdef UDATA_DEBUG
            fprintf(stderr, "%s: Found.\n", toc->entry[number].entryName);
#endif
            *pLength=-1;
            return UDataMemory_normalizeDataPointer(toc->entry[number].pHeader);
        } else {
#ifdef UDATA_DEBUG
            fprintf(stderr, "%s: Not found.\n", name);
#endif
            return NULL;
        }
    } else {
        return pData->pHeader;
    }
}